

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::ToJsonMapInternal
                   (string *__return_storage_ptr__,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *map,yyjson_mut_doc *doc,yyjson_mut_val *root)

{
  yyjson_val_pool *pool;
  yyjson_alc *alc;
  yyjson_str_pool *pool_00;
  _Hash_node_base __src;
  _Hash_node_base *p_Var1;
  _Hash_node_base *__n;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  yyjson_mut_doc *extraout_RDX;
  yyjson_mut_doc *extraout_RDX_00;
  yyjson_mut_doc *pyVar6;
  yyjson_mut_doc *extraout_RDX_01;
  yyjson_mut_doc *extraout_RDX_02;
  yyjson_mut_doc *extraout_RDX_03;
  yyjson_mut_doc *extraout_RDX_04;
  char *pcVar7;
  yyjson_mut_val *pyVar8;
  __node_base *p_Var9;
  yyjson_mut_val *pyVar10;
  yyjson_mut_val *pyVar11;
  
  p_Var9 = &(map->_M_h)._M_before_begin;
  pool = &doc->val_pool;
  alc = &doc->alc;
  pool_00 = &doc->str_pool;
  pyVar6 = doc;
  do {
    p_Var9 = p_Var9->_M_nxt;
    if (p_Var9 == (__node_base *)0x0) {
      WriteJsonToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,pyVar6);
      return __return_storage_ptr__;
    }
    if (doc == (yyjson_mut_doc *)0x0) {
      pyVar11 = (yyjson_mut_val *)0x0;
    }
    else {
      __src._M_nxt = p_Var9[1]._M_nxt;
      pyVar11 = (yyjson_mut_val *)0x0;
      if (__src._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor;
        pyVar11 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar11) {
          bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,alc,1);
          pyVar6 = extraout_RDX_01;
          if (bVar4) {
            pyVar11 = pool->cur;
            goto LAB_017bc649;
          }
          pyVar11 = (yyjson_mut_val *)0x0;
        }
        else {
LAB_017bc649:
          pool->cur = pyVar11 + 1;
        }
        pcVar7 = (doc->str_pool).cur;
        if (p_Var1 < (_Hash_node_base *)((doc->str_pool).end + -(long)pcVar7)) {
LAB_017bc665:
          pool_00->cur = pcVar7 + (long)((long)&p_Var1->_M_nxt + 1);
          if (pcVar7 != (char *)0x0) {
            switchD_016b0717::default(pcVar7,__src._M_nxt,(size_t)p_Var1);
            pcVar7[(long)p_Var1] = '\0';
            pyVar6 = extraout_RDX;
            if (pyVar11 == (yyjson_mut_val *)0x0) {
              pyVar11 = (yyjson_mut_val *)0x0;
            }
            else {
              pyVar11->tag = (long)p_Var1 << 8 | 5;
              (pyVar11->uni).ptr = pcVar7;
            }
            goto LAB_017bc6b2;
          }
        }
        else {
          bVar4 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                            (pool_00,alc,(usize)((long)&p_Var1->_M_nxt + 1));
          pyVar6 = extraout_RDX_02;
          if (bVar4) {
            pcVar7 = pool_00->cur;
            goto LAB_017bc665;
          }
        }
        pyVar11 = (yyjson_mut_val *)0x0;
      }
    }
LAB_017bc6b2:
    if (doc == (yyjson_mut_doc *)0x0) {
      pyVar10 = (yyjson_mut_val *)0x0;
    }
    else {
      p_Var1 = p_Var9[5]._M_nxt;
      pyVar10 = (yyjson_mut_val *)0x0;
      if (p_Var1 != (_Hash_node_base *)0x0) {
        __n = p_Var9[6]._M_nxt;
        pyVar10 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar10) {
          bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,alc,1);
          pyVar6 = extraout_RDX_03;
          if (bVar4) {
            pyVar10 = pool->cur;
            goto LAB_017bc6de;
          }
          pyVar10 = (yyjson_mut_val *)0x0;
        }
        else {
LAB_017bc6de:
          pool->cur = pyVar10 + 1;
        }
        pcVar7 = (doc->str_pool).cur;
        if (__n < (_Hash_node_base *)((doc->str_pool).end + -(long)pcVar7)) {
LAB_017bc6fa:
          pool_00->cur = pcVar7 + (long)((long)&__n->_M_nxt + 1);
          if (pcVar7 != (char *)0x0) {
            switchD_016b0717::default(pcVar7,p_Var1,(size_t)__n);
            pcVar7[(long)__n] = '\0';
            pyVar6 = extraout_RDX_00;
            if (pyVar10 == (yyjson_mut_val *)0x0) {
              pyVar10 = (yyjson_mut_val *)0x0;
            }
            else {
              pyVar10->tag = (long)__n << 8 | 5;
              (pyVar10->uni).ptr = pcVar7;
            }
            goto LAB_017bc745;
          }
        }
        else {
          bVar4 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                            (pool_00,alc,(usize)((long)&__n->_M_nxt + 1));
          pyVar6 = extraout_RDX_04;
          if (bVar4) {
            pcVar7 = pool_00->cur;
            goto LAB_017bc6fa;
          }
        }
        pyVar10 = (yyjson_mut_val *)0x0;
      }
    }
LAB_017bc745:
    if (root != (yyjson_mut_val *)0x0) {
      uVar2 = root->tag;
      pyVar6 = (yyjson_mut_doc *)(ulong)~(uint)uVar2;
      if (((((~(uint)uVar2 & 7) == 0) && (pyVar11 != (yyjson_mut_val *)0x0)) &&
          (uVar5 = (uint)pyVar11->tag & 7, pyVar6 = (yyjson_mut_doc *)(ulong)uVar5, uVar5 == 5)) &&
         (pyVar10 != (yyjson_mut_val *)0x0)) {
        pyVar8 = pyVar11;
        if (0xff < uVar2) {
          lVar3 = *(long *)((root->uni).u64 + 0x10);
          pyVar8 = *(yyjson_mut_val **)(lVar3 + 0x10);
          *(yyjson_mut_val **)(lVar3 + 0x10) = pyVar11;
        }
        pyVar6 = (yyjson_mut_doc *)(uVar2 & 0xffffffffffffff00);
        pyVar10->next = pyVar8;
        pyVar11->next = pyVar10;
        (root->uni).str = (char *)pyVar11;
        root->tag = (long)&pyVar6[2].alc.realloc + (uVar2 & 0xff);
      }
    }
  } while( true );
}

Assistant:

string ToJsonMapInternal(const unordered_map<string, string> &map, yyjson_mut_doc *doc, yyjson_mut_val *root) {
	for (auto &entry : map) {
		auto key = yyjson_mut_strncpy(doc, entry.first.c_str(), entry.first.size());
		auto value = yyjson_mut_strncpy(doc, entry.second.c_str(), entry.second.size());
		yyjson_mut_obj_add(root, key, value);
	}
	return WriteJsonToString(doc);
}